

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

int * GetHashTable(BrotliEncoderStateInternal *s,int quality,size_t input_size,size_t *table_size)

{
  int iVar1;
  void *pvVar2;
  ulong *in_RCX;
  size_t in_RDX;
  int in_ESI;
  long in_RDI;
  int *table;
  size_t htsize;
  size_t max_table_size;
  MemoryManager *m;
  void *in_stack_ffffffffffffffa8;
  MemoryManager *in_stack_ffffffffffffffb0;
  int *local_48;
  ulong local_40;
  
  iVar1 = 0x20000;
  if (in_ESI == 0) {
    iVar1 = 0x8000;
  }
  local_40 = HashTableSize((long)iVar1,in_RDX);
  if ((in_ESI == 0) && ((local_40 & 0xaaaaa) == 0)) {
    local_40 = local_40 << 1;
  }
  if (local_40 < 0x401) {
    local_48 = (int *)(in_RDI + 0xad0);
  }
  else {
    if (*(ulong *)(in_RDI + 0x1ad8) < local_40) {
      *(ulong *)(in_RDI + 0x1ad8) = local_40;
      duckdb_brotli::BrotliFree(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(undefined8 *)(in_RDI + 0x1ad0) = 0;
      if (local_40 == 0) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = duckdb_brotli::BrotliAllocate
                           (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      }
      *(void **)(in_RDI + 0x1ad0) = pvVar2;
    }
    local_48 = *(int **)(in_RDI + 0x1ad0);
  }
  *in_RCX = local_40;
  memset(local_48,0,local_40 << 2);
  return local_48;
}

Assistant:

static int* GetHashTable(BrotliEncoderState* s, int quality,
                         size_t input_size, size_t* table_size) {
  /* Use smaller hash table when input.size() is smaller, since we
     fill the table, incurring O(hash table size) overhead for
     compression, and if the input is short, we won't need that
     many hash table entries anyway. */
  MemoryManager* m = &s->memory_manager_;
  const size_t max_table_size = MaxHashTableSize(quality);
  size_t htsize = HashTableSize(max_table_size, input_size);
  int* table;
  BROTLI_DCHECK(max_table_size >= 256);
  if (quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
    /* Only odd shifts are supported by fast-one-pass. */
    if ((htsize & 0xAAAAA) == 0) {
      htsize <<= 1;
    }
  }

  if (htsize <= sizeof(s->small_table_) / sizeof(s->small_table_[0])) {
    table = s->small_table_;
  } else {
    if (htsize > s->large_table_size_) {
      s->large_table_size_ = htsize;
      BROTLI_FREE(m, s->large_table_);
      s->large_table_ = BROTLI_ALLOC(m, int, htsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->large_table_)) return 0;
    }
    table = s->large_table_;
  }

  *table_size = htsize;
  memset(table, 0, htsize * sizeof(*table));
  return table;
}